

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void copyFile(string *from,string *to)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  allocator local_17c;
  allocator local_17b;
  allocator local_17a;
  allocator local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string command2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string override_permission;
  
  bVar1 = Settings::canOverwriteFiles();
  bVar2 = std::operator!=(from,to);
  if ((!bVar1) && (bVar2)) {
    bVar2 = fileExists(to);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"\n\nError : File ");
      poVar4 = std::operator<<(poVar4,(to->_M_dataplus)._M_p);
      poVar4 = std::operator<<(poVar4," already exists. Remove it or enable overwriting.");
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_001167aa;
    }
  }
  pcVar5 = "-n ";
  if (bVar1) {
    pcVar5 = "-f ";
  }
  std::__cxx11::string::string((string *)&override_permission,pcVar5,(allocator *)&command);
  std::__cxx11::string::string((string *)&local_78,"cp ",&local_179);
  std::operator+(&local_58,&local_78,&override_permission);
  std::__cxx11::string::string((string *)&local_98,"\"",&local_17a);
  std::operator+(&local_118,&local_58,&local_98);
  std::operator+(&local_178,&local_118,from);
  std::__cxx11::string::string((string *)&local_b8,"\" \"",&local_17b);
  std::operator+(&local_158,&local_178,&local_b8);
  std::operator+(&command2,&local_158,to);
  std::__cxx11::string::string((string *)&local_d8,"\"",&local_17c);
  std::operator+(&command,&command2,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&command2);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = std::operator!=(from,to);
  if (bVar1) {
    iVar3 = systemp(&command);
    if (iVar3 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "\n\nError : An error occured while trying to copy file ");
      poVar4 = std::operator<<(poVar4,(string *)from);
      poVar4 = std::operator<<(poVar4," to ");
      poVar4 = std::operator<<(poVar4,(string *)to);
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_001167aa;
    }
  }
  std::__cxx11::string::string((string *)&local_178,"chmod +w \"",(allocator *)&local_118);
  std::operator+(&local_158,&local_178,to);
  std::operator+(&command2,&local_158,"\"");
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  iVar3 = systemp(&command2);
  if (iVar3 == 0) {
    std::__cxx11::string::~string((string *)&command2);
    std::__cxx11::string::~string((string *)&command);
    std::__cxx11::string::~string((string *)&override_permission);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\n\nError : An error occured while trying to set write permissions on file "
                          );
  poVar4 = std::operator<<(poVar4,(string *)to);
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_001167aa:
  exit(1);
}

Assistant:

void copyFile(const string& from, const string& to)
{
    bool override = Settings::canOverwriteFiles();
    if( from != to && !override )
    {
        if(fileExists( to ))
        {
            cerr << "\n\nError : File " << to.c_str() << " already exists. Remove it or enable overwriting." << endl;
            exit(1);
        }
    }

    string override_permission = string(override ? "-f " : "-n ");
        
    // copy file to local directory
    string command = string("cp ") + override_permission + string("\"") + from + string("\" \"") + to + string("\"");
    if( from != to && systemp( command ) != 0 )
    {
        cerr << "\n\nError : An error occured while trying to copy file " << from << " to " << to << endl;
        exit(1);
    }
    
    // give it write permission
    string command2 = string("chmod +w \"") + to + "\"";
    if( systemp( command2 ) != 0 )
    {
        cerr << "\n\nError : An error occured while trying to set write permissions on file " << to << endl;
        exit(1);
    }
}